

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O2

void __thiscall ConvertorXMI2MID::write_chunk(ConvertorXMI2MID *this,string *id,PBuffer *data)

{
  MutableBuffer *this_00;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  MutableBuffer::push((this->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,id);
  MutableBuffer::push<unsigned_int>
            ((this->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (uint)((data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->size,1);
  this_00 = (this->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,&data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  MutableBuffer::push(this_00,(PBuffer *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return;
}

Assistant:

void
ConvertorXMI2MID::write_chunk(const std::string &id, PBuffer data) {
  result->push(id);
  result->push<uint32_t>(static_cast<uint32_t>(data->get_size()));
  result->push(data);
}